

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

_Bool sysbvm_tuple_isTypeSatisfiedWithValue
                (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t value)

{
  _Bool _Var1;
  ulong uVar2;
  
  if (value == 0) {
    if (type == 0) {
      return true;
    }
    if (((type & 0xf) == 0) && ((*(byte *)(type + 8) & 0x80) == 0)) {
      uVar2 = *(ulong *)(type + 0x70);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        uVar2 = (long)uVar2 >> 4;
      }
      else {
        uVar2 = *(ulong *)(uVar2 + 0x10);
      }
      if ((uVar2 & 1) != 0) {
        return true;
      }
    }
    value = 0;
  }
  _Var1 = sysbvm_tuple_isKindOf(context,value,type);
  return _Var1;
}

Assistant:

SYSBVM_API bool sysbvm_tuple_isTypeSatisfiedWithValue(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t value)
{
    if(!value && sysbvm_type_isNullable(type))
        return true;
    return sysbvm_tuple_isKindOf(context, value, type);
}